

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O3

void Dam_ManCollectSets_rec(Dam_Man_t *p,int Id)

{
  Gia_Obj_t *pObj;
  int iVar1;
  Gia_Man_t *p_00;
  ulong uVar2;
  uint *puVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar10 = (ulong)(uint)Id;
  while( true ) {
    iVar7 = (int)uVar10;
    if (iVar7 < p->vNod2Set->nSize) {
      if (iVar7 < 0) goto LAB_0070a404;
      bVar11 = p->vNod2Set->pArray[uVar10] != 0;
    }
    else {
      bVar11 = false;
    }
    if (iVar7 == 0) {
      return;
    }
    if (bVar11) {
      return;
    }
    if ((iVar7 < 0) || (p_00 = p->pGia, p_00->nObjs <= iVar7)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar2 = *(ulong *)(p_00->pObjs + uVar10);
    uVar6 = (uint)uVar2;
    if ((~uVar6 & 0x9fffffff) == 0) {
      return;
    }
    if ((((int)uVar6 < 0) || (uVar8 = uVar6 & 0x1fffffff, uVar8 == 0x1fffffff)) ||
       (uVar8 != ((uint)(uVar2 >> 0x20) & 0x1fffffff))) break;
    uVar10 = (ulong)(iVar7 - uVar8);
  }
  pObj = p_00->pObjs + uVar10;
  if ((p_00->pMuxes == (uint *)0x0) || (p_00->pMuxes[uVar10] == 0)) {
    Gia_ManSuperCollect(p_00,pObj,0);
    if (p->vNod2Set->nSize <= iVar7) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    pVVar4 = p->vSetStore;
    p->vNod2Set->pArray[uVar10] = pVVar4->nSize;
    Vec_IntPush(pVVar4,p->pGia->vSuper->nSize);
    uVar6 = (uint)*(undefined8 *)pObj;
    iVar7 = 1;
    if ((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) {
      iVar7 = (uint)((uVar6 & 0x1fffffff) <
                    ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff)) * 2 + 1;
    }
    pVVar4 = p->vSetStore;
    pVVar5 = p->pGia->vSuper;
    iVar1 = pVVar5->nSize;
    p->nAnds = p->nAnds + (iVar1 + -1) * iVar7;
    if (0 < iVar1) {
      uVar6 = pVVar4->nSize;
      uVar10 = (ulong)uVar6;
      lVar9 = 0;
      do {
        Vec_IntPush(pVVar4,pVVar5->pArray[lVar9]);
        lVar9 = lVar9 + 1;
      } while (lVar9 < pVVar5->nSize);
      iVar7 = p->vSetStore->nSize;
      uVar8 = uVar6;
      while ((int)uVar8 < iVar7) {
        if (((int)uVar6 < 0) || (p->vSetStore->nSize <= (int)uVar10)) {
LAB_0070a404:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar8 = p->vSetStore->pArray[uVar10];
        if ((int)uVar8 < 0) goto LAB_0070a423;
        Dam_ManCollectSets_rec(p,uVar8 >> 1);
        uVar10 = uVar10 + 1;
        uVar8 = (uint)uVar10;
      }
    }
  }
  else if ((uVar6 >> 0x1e & 1) == 0) {
    *(ulong *)pObj = uVar2 | 0x40000000;
    Vec_IntPush(p->vVisit,iVar7);
    Dam_ManCollectSets_rec(p,iVar7 - (*(uint *)pObj & 0x1fffffff));
    Dam_ManCollectSets_rec(p,iVar7 - (*(uint *)&pObj->field_0x4 & 0x1fffffff));
    puVar3 = p->pGia->pMuxes;
    uVar6 = 0xffffffff;
    if (puVar3 != (uint *)0x0) {
      uVar8 = puVar3[uVar10];
      if (uVar8 != 0) {
        if ((int)uVar8 < 0) {
LAB_0070a423:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar6 = uVar8 >> 1;
      }
    }
    Dam_ManCollectSets_rec(p,uVar6);
    p->nAnds = p->nAnds + 3;
  }
  return;
}

Assistant:

void Dam_ManCollectSets_rec( Dam_Man_t * p, int Id )
{
    Gia_Obj_t * pObj;
    int i, iBeg, iEnd, iLit;
    if ( Dam_ObjHand(p, Id) || Id == 0 )
        return;
    pObj = Gia_ManObj(p->pGia, Id);
    if ( Gia_ObjIsCi(pObj) )
        return;
    if ( Gia_ObjIsBuf(pObj) )
    {
        Dam_ManCollectSets_rec( p, Gia_ObjFaninId0(pObj, Id) );
        return;
    }
    if ( Gia_ObjIsMux(p->pGia, pObj) )
    {
        if ( pObj->fMark0 )
            return;
        pObj->fMark0 = 1;
        Vec_IntPush( p->vVisit, Id );
        Dam_ManCollectSets_rec( p, Gia_ObjFaninId0(pObj, Id) );
        Dam_ManCollectSets_rec( p, Gia_ObjFaninId1(pObj, Id) );
        Dam_ManCollectSets_rec( p, Gia_ObjFaninId2(p->pGia, Id) );
        p->nAnds += 3;
        return;
    }
    Gia_ManSuperCollect( p->pGia, pObj, 0 );
    Vec_IntWriteEntry( p->vNod2Set, Id, Vec_IntSize(p->vSetStore) );
    Vec_IntPush( p->vSetStore, Vec_IntSize(p->pGia->vSuper) );
    p->nAnds += (1 + 2 * Gia_ObjIsXor(pObj)) * (Vec_IntSize(p->pGia->vSuper) - 1);
    // save entries
    iBeg = Vec_IntSize( p->vSetStore );
    Vec_IntAppend( p->vSetStore, p->pGia->vSuper );
    iEnd = Vec_IntSize( p->vSetStore );
    // call recursively
    Vec_IntForEachEntryStartStop( p->vSetStore, iLit, i, iBeg, iEnd )
        Dam_ManCollectSets_rec( p, Abc_Lit2Var(iLit) );
}